

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O3

Action __thiscall
psy::C::SyntaxDumper::visitFieldDeclaration(SyntaxDumper *this,FieldDeclarationSyntax *node)

{
  SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *this_00;
  SpecifierListSyntax *pSVar1;
  SyntaxToken SStack_58;
  
  traverseDeclaration(this,(DeclarationSyntax *)node);
  for (pSVar1 = node->specs_; pSVar1 != (SpecifierListSyntax *)0x0;
      pSVar1 = (pSVar1->
               super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               ).
               super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
               .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(pSVar1->
                    super_CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    ).
                    super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                    .value);
  }
  for (this_00 = node->decltors_;
      this_00 != (SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*> *)0x0;
      this_00 = (this_00->
                super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                ).
                super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                .next) {
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])
              (this,(this_00->
                    super_CoreSyntaxNodeList<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                    ).
                    super_List<psy::C::DeclaratorSyntax_*,_psy::C::SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>_>
                    .value);
    SyntaxNodeSeparatedList<psy::C::DeclaratorSyntax_*>::delimiterToken(&SStack_58,this_00);
    (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
    SyntaxToken::~SyntaxToken(&SStack_58);
  }
  SyntaxNode::tokenAtIndex(&SStack_58,(SyntaxNode *)node,node->semicolonTkIdx_);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&SStack_58,node);
  SyntaxToken::~SyntaxToken(&SStack_58);
  return Skip;
}

Assistant:

virtual Action visitFieldDeclaration(const FieldDeclarationSyntax* node) override
    {
        traverseDeclaration(node);
        for (auto iter = node->specifiers(); iter; iter = iter->next)
            nonterminal(iter->value);
        for (auto iter = node->declarators(); iter; iter = iter->next) {
            nonterminal(iter->value);
            terminal(iter->delimiterToken(), node);
        }
        terminal(node->semicolonToken(), node);
        return Action::Skip;
    }